

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O3

void __thiscall Dice::rollDiceSequence(Dice *this)

{
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *p_Var1;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *p_Var2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  int iVar6;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  this->numberOfRolls = 3;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Rolling first hand of dice for player",0x25);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->playerNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Press enter to continue",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  std::ostream::put(-0x30);
  std::ostream::flush();
  std::istream::ignore();
  iVar6 = 6;
  while( true ) {
    rollDice(this,iVar6);
    iVar6 = this->numberOfRolls;
    this->numberOfRolls = iVar6 + -1;
    if (1 < iVar6 - 2U) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Sequence number ",0x10);
    plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->numberOfRolls);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    iVar3 = addToCount(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Rolling ",8);
    iVar6 = 6 - iVar3;
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," dice since you saved: ",0x17);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  if (iVar6 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\n No hands left: Resolving ......",0x21);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::
    _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::_Rb_tree(&local_60,&(this->resolvedHand)._M_t);
    std::
    vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
    ::push_back(&this->historyOfResolvedRolls,(value_type *)&local_60);
    std::
    _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
    ::~_Rb_tree(&local_60);
    resetResolvedHand(this);
    resetDiceValuesMap(this);
    p_Var1 = &((this->historyOfRolls).
               super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t;
    p_Var2 = &((this->historyOfRolls).
               super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
    this_00 = p_Var1;
    if (p_Var2 != p_Var1) {
      do {
        std::
        _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
        ::~_Rb_tree(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != p_Var2);
      (this->historyOfRolls).
      super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Resolved Final Values ---------------------------",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    diceHistoricalResolvedValues(this);
  }
  return;
}

Assistant:

void Dice::rollDiceSequence() {
    resetDiceRolls();

    cout << "Rolling first hand of dice for player" << this->getPlayerNumber() << "\n";
    cout << "Press enter to continue" << endl;
    cin.ignore();
    this->rollDice(6);
    numberOfRolls--;

    while (getNumbOfRollsRemaining() == 1 || getNumbOfRollsRemaining() == 2) {         // roll 2
        cout << "Sequence number " << getNumbOfRollsRemaining() << endl;
        int count =0;
        count = addToCount();
        cout << "Rolling " << (6-count) << " dice since you saved: " << count << "\n";

        this->rollDice(6-count);
        numberOfRolls--;
    }

    if (getNumbOfRollsRemaining() == 0) {
        cout << "\n No hands left: Resolving ......" << endl;
        storeResolvedHand(resolvedHand);
        resetResolvedHand();
        resetDiceValuesMap();
        historyOfRolls.clear();

        cout << "Resolved Final Values ---------------------------" << endl;
        this->diceHistoricalResolvedValues();
    }


}